

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

QByteArray * __thiscall
QIODevicePrivate::peek(QByteArray *__return_storage_ptr__,QIODevicePrivate *this,qint64 maxSize)

{
  Data *pDVar1;
  ssize_t size;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,maxSize,Uninitialized);
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  size = read(this,(int)(__return_storage_ptr__->d).ptr,(void *)maxSize,1);
  if (size < maxSize) {
    if (size < 1) {
      QByteArray::clear(__return_storage_ptr__);
    }
    else {
      QByteArray::resize(__return_storage_ptr__,size);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QIODevicePrivate::peek(qint64 maxSize)
{
    QByteArray result(maxSize, Qt::Uninitialized);

    const qint64 readBytes = read(result.data(), maxSize, true);

    if (readBytes < maxSize) {
        if (readBytes <= 0)
            result.clear();
        else
            result.resize(readBytes);
    }

    return result;
}